

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O0

void Gia_ManArePrintReport(Gia_ManAre_t *p,abctime Time,int fFinal)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  abctime aVar7;
  int fFinal_local;
  abctime Time_local;
  Gia_ManAre_t *p_local;
  
  uVar1 = p->iStaCur;
  uVar2 = p->nStas;
  iVar3 = p->iStaCur;
  iVar4 = p->nStas;
  uVar5 = Gia_ManAreDepth(p,p->iStaCur);
  iVar6 = Gia_ManRegNum(p->pAig);
  printf("States =%10d. Reached =%10d. R = %5.3f. Depth =%6d. Mem =%9.2f MB.  ",
         ((double)iVar3 * 1.0) / (double)iVar4,
         ((double)p->nObjPages * 16.0 * 1048576.0 +
         (double)p->nStaPages * 4.0 * (double)p->nSize * 1048576.0 +
         (double)iVar6 * 4.0 + 200.0 + 16384.0) / 1048576.0,(ulong)uVar1,(ulong)uVar2,(ulong)uVar5);
  if (fFinal == 0) {
    Abc_Print(1,"%s =","Time");
    aVar7 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\r",((double)(aVar7 - Time) * 1.0) / 1000000.0);
  }
  else {
    Abc_Print(1,"%s =","Time");
    aVar7 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar7 - Time) * 1.0) / 1000000.0);
  }
  return;
}

Assistant:

void Gia_ManArePrintReport( Gia_ManAre_t * p, abctime Time, int fFinal )
{
    printf( "States =%10d. Reached =%10d. R = %5.3f. Depth =%6d. Mem =%9.2f MB.  ", 
        p->iStaCur, p->nStas, 1.0*p->iStaCur/p->nStas, Gia_ManAreDepth(p, p->iStaCur), 
        (sizeof(Gia_ManAre_t) + 4.0*Gia_ManRegNum(p->pAig) + 8.0*MAX_PAGE_NUM + 
         4.0*p->nStaPages*p->nSize*MAX_ITEM_NUM + 16.0*p->nObjPages*MAX_ITEM_NUM)/(1<<20) );
    if ( fFinal )
    {
        ABC_PRT( "Time", Abc_Clock() - Time );
    }
    else
    {
        ABC_PRTr( "Time", Abc_Clock() - Time );
    }
}